

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O3

int lj_cf_table_concat(lua_State *L)

{
  MSize n;
  MSize MVar1;
  uint uVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  ulong uVar5;
  MSize MVar6;
  GCstr *local_2050;
  luaL_Buffer local_2048;
  
  pTVar3 = L->base;
  if ((L->top <= pTVar3) || ((pTVar3->field_2).it != 0xfffffff4)) {
    lj_err_argt(L,1,5);
  }
  uVar2 = (pTVar3->u32).lo;
  if ((pTVar3 + 1 < L->top) && (*(int *)((long)pTVar3 + 0xc) != -1)) {
    local_2050 = lj_lib_checkstr(L,2);
    if (local_2050 != (GCstr *)0x0) {
      MVar6 = local_2050->len;
      goto LAB_001452df;
    }
  }
  local_2050 = (GCstr *)0x0;
  MVar6 = 0;
LAB_001452df:
  pTVar3 = L->base;
  pTVar4 = L->top;
  n = 1;
  if ((pTVar3 + 2 < pTVar4) && (*(int *)((long)pTVar3 + 0x14) != -1)) {
    n = lj_lib_checkint(L,3);
    pTVar3 = L->base;
    pTVar4 = L->top;
  }
  if ((pTVar3 + 3 < pTVar4) && (*(int *)((long)pTVar3 + 0x1c) != -1)) {
    MVar1 = lj_lib_checkint(L,4);
  }
  else {
    MVar1 = lj_tab_len((GCtab *)(ulong)uVar2);
  }
  local_2048.p = local_2048.buffer;
  local_2048.lvl = 0;
  local_2048.L = L;
  if ((int)MVar1 < (int)n) {
LAB_00145354:
    emptybuffer(&local_2048);
    lua_concat(local_2048.L,local_2048.lvl);
    return 1;
  }
  lua_rawgeti(L,1,n);
  uVar2 = *(uint *)((long)L->top + -4);
  if (uVar2 == 0xfffffffb || uVar2 < 0xffff0000) {
    do {
      luaL_addvalue(&local_2048);
      if (MVar1 == n) goto LAB_00145354;
      if (MVar6 != 0) {
        luaL_addlstring(&local_2048,(char *)(local_2050 + 1),(ulong)MVar6);
      }
      n = n + 1;
      lua_rawgeti(L,1,n);
      uVar2 = *(uint *)((long)L->top + -4);
    } while (uVar2 < 0xffff0000 || uVar2 == 0xfffffffb);
  }
  uVar5 = 3;
  if ((uVar2 & 0xffff8000) != 0xffff0000) {
    uVar5 = (ulong)~uVar2;
  }
  lj_err_callerv(L,LJ_ERR_TABCAT,lj_obj_itypename[uVar5],(ulong)n);
}

Assistant:

LJLIB_CF(table_concat)
{
  luaL_Buffer b;
  GCtab *t = lj_lib_checktab(L, 1);
  GCstr *sep = lj_lib_optstr(L, 2);
  MSize seplen = sep ? sep->len : 0;
  int32_t i = lj_lib_optint(L, 3, 1);
  int32_t e = (L->base+3 < L->top && !tvisnil(L->base+3)) ?
	      lj_lib_checkint(L, 4) : (int32_t)lj_tab_len(t);
  luaL_buffinit(L, &b);
  if (i <= e) {
    for (;;) {
      cTValue *o;
      lua_rawgeti(L, 1, i);
      o = L->top-1;
      if (!(tvisstr(o) || tvisnumber(o)))
	lj_err_callerv(L, LJ_ERR_TABCAT, lj_typename(o), i);
      luaL_addvalue(&b);
      if (i++ == e) break;
      if (seplen)
	luaL_addlstring(&b, strdata(sep), seplen);
    }
  }
  luaL_pushresult(&b);
  return 1;
}